

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializePromiseConstructor
               (DynamicObject *promiseConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  bool bVar1;
  JavascriptLibrary *this;
  ScriptContext *this_00;
  Var value;
  DynamicObject **ppDVar2;
  PropertyString *value_00;
  ScriptConfiguration *this_01;
  JavascriptFunction *value_01;
  ScriptContext *scriptContext;
  JavascriptLibrary *library;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *promiseConstructor_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,promiseConstructor,mode,9,0);
  this = RecyclableObject::GetLibrary(&promiseConstructor->super_RecyclableObject);
  this_00 = RecyclableObject::GetScriptContext(&promiseConstructor->super_RecyclableObject);
  value = TaggedInt::ToVarUnchecked(1);
  AddMember(this,promiseConstructor,0xd1,value,'\x02');
  ppDVar2 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).promisePrototype);
  AddMember(this,promiseConstructor,0x124,*ppDVar2,'\0');
  AddSpeciesAccessorsToLibraryObject
            (this,promiseConstructor,
             (FunctionInfo *)JavascriptPromise::EntryInfo::GetterSymbolSpecies);
  value_00 = ScriptContext::GetPropertyString(this_00,0x43);
  AddMember(this,promiseConstructor,0x106,value_00,'\x02');
  AddFunctionToLibraryObject
            (this,promiseConstructor,0x4b,(FunctionInfo *)JavascriptPromise::EntryInfo::All,1,'\x06'
            );
  AddFunctionToLibraryObject
            (this,promiseConstructor,0x4c,(FunctionInfo *)JavascriptPromise::EntryInfo::AllSettled,1
             ,'\x06');
  this_01 = ScriptContext::GetConfig(this_00);
  bVar1 = ScriptConfiguration::IsESPromiseAnyEnabled(this_01);
  if (bVar1) {
    AddFunctionToLibraryObject
              (this,promiseConstructor,0x1f,(FunctionInfo *)JavascriptPromise::EntryInfo::Any,1,
               '\x06');
  }
  AddFunctionToLibraryObject
            (this,promiseConstructor,0x128,(FunctionInfo *)JavascriptPromise::EntryInfo::Race,1,
             '\x06');
  AddFunctionToLibraryObject
            (this,promiseConstructor,0x131,(FunctionInfo *)JavascriptPromise::EntryInfo::Reject,1,
             '\x06');
  value_01 = EnsurePromiseResolveFunction(this);
  AddMember(this,promiseConstructor,0x134,value_01,'\x06');
  DynamicObject::SetHasNoEnumerableProperties(promiseConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializePromiseConstructor(DynamicObject* promiseConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(promiseConstructor, mode, 9);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterPromise
        // so that the update is in sync with profiler
        JavascriptLibrary* library = promiseConstructor->GetLibrary();
        ScriptContext* scriptContext = promiseConstructor->GetScriptContext();
        library->AddMember(promiseConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(promiseConstructor, PropertyIds::prototype, library->promisePrototype, PropertyNone);
        library->AddSpeciesAccessorsToLibraryObject(promiseConstructor, &JavascriptPromise::EntryInfo::GetterSymbolSpecies);
        library->AddMember(promiseConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::Promise), PropertyConfigurable);

        library->AddFunctionToLibraryObject(promiseConstructor, PropertyIds::all, &JavascriptPromise::EntryInfo::All, 1);
        library->AddFunctionToLibraryObject(promiseConstructor, PropertyIds::allSettled, &JavascriptPromise::EntryInfo::AllSettled, 1);
        if (scriptContext->GetConfig()->IsESPromiseAnyEnabled())
        {
            library->AddFunctionToLibraryObject(promiseConstructor, PropertyIds::any, &JavascriptPromise::EntryInfo::Any, 1);
        }
        library->AddFunctionToLibraryObject(promiseConstructor, PropertyIds::race, &JavascriptPromise::EntryInfo::Race, 1);
        library->AddFunctionToLibraryObject(promiseConstructor, PropertyIds::reject, &JavascriptPromise::EntryInfo::Reject, 1);
        library->AddMember(promiseConstructor, PropertyIds::resolve, library->EnsurePromiseResolveFunction(), PropertyBuiltInMethodDefaults);

        promiseConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }